

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-parsing-utils.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  byte bVar2;
  char cVar3;
  float fVar4;
  char *__s2;
  long lVar5;
  uchar uVar6;
  _Bool _Var7;
  byte bVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  double dVar12;
  undefined8 local_38;
  double local_30;
  
  GREATEST_INIT();
  if (1 < argc) {
    iVar9 = 1;
    uVar6 = greatest_info.verbosity;
    bVar8 = greatest_info.flags;
    do {
      __s2 = argv[iVar9];
      if (*__s2 == '-') {
        bVar2 = __s2[1];
        switch(bVar2) {
        case 0x65:
          greatest_info.exact_name_match = '\x01';
          break;
        case 0x66:
          bVar8 = bVar8 | 1;
          greatest_info.flags = bVar8;
          break;
        case 0x67:
        case 0x69:
        case 0x6a:
        case 0x6b:
        case 0x6d:
        case 0x6e:
        case 0x6f:
        case 0x70:
        case 0x71:
        case 0x72:
        case 0x75:
        case 0x77:
switchD_00102df7_caseD_67:
          iVar9 = strncmp("--help",__s2,6);
          if (iVar9 == 0) {
switchD_00102df7_caseD_68:
            greatest_usage(*argv);
            exit(0);
          }
          uVar11 = bVar2 - 0x2d;
          if (uVar11 == 0) {
            uVar11 = (uint)(byte)__s2[2];
          }
          if (uVar11 != 0) {
            fprintf(_stdout,"Unknown argument \'%s\'\n",__s2);
LAB_001033ff:
            greatest_usage(*argv);
            exit(1);
          }
          goto LAB_00102e8c;
        case 0x68:
          goto switchD_00102df7_caseD_68;
        case 0x6c:
          bVar8 = bVar8 | 2;
          greatest_info.flags = bVar8;
          break;
        case 0x73:
        case 0x74:
        case 0x78:
          iVar1 = iVar9 + 1;
          if (argc <= iVar1) goto LAB_001033ff;
          switch(bVar2) {
          case 0x73:
            greatest_info.suite_filter = argv[iVar1];
            iVar9 = iVar1;
            break;
          case 0x74:
            greatest_info.test_filter = argv[iVar1];
            iVar9 = iVar1;
            break;
          default:
            goto switchD_00102df7_caseD_67;
          case 0x76:
            goto switchD_00102df7_caseD_76;
          case 0x78:
            greatest_info.test_exclude = argv[iVar1];
            iVar9 = iVar1;
          }
          break;
        case 0x76:
switchD_00102df7_caseD_76:
          uVar6 = uVar6 + '\x01';
          greatest_info.verbosity = uVar6;
          break;
        default:
          if (bVar2 != 0x61) goto switchD_00102df7_caseD_67;
          bVar8 = bVar8 | 4;
          greatest_info.flags = bVar8;
        }
      }
      iVar9 = iVar9 + 1;
    } while (iVar9 < argc);
  }
LAB_00102e8c:
  iVar9 = greatest_test_pre("parsing_int32");
  if (iVar9 == 1) {
    lVar10 = 0xc;
    do {
      fVar4 = *(float *)((long)&__do_global_dtors_aux_fini_array_entry + lVar10 + 4);
      _Var7 = str_to_int32(*(char **)((long)&__frame_dummy_init_array_entry + lVar10 + 4),
                           (int32_t *)&local_38);
      if ((_Bool)*(char *)((long)&parsing_int32_i32_tests + lVar10) != _Var7) {
        greatest_info.fail_line = 0x5f;
        greatest_info.msg = "i32_tests[i].expect_success != success";
        greatest_info.assertions = greatest_info.assertions + 1;
LAB_00102f46:
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-parsing-utils.c"
        ;
        if ((greatest_info.flags & 4) != 0) goto LAB_00103411;
        iVar9 = -1;
        goto LAB_00102f5f;
      }
      uVar11 = greatest_info.assertions + 1;
      if ((_Var7) && (uVar11 = greatest_info.assertions + 2, fVar4 != (float)local_38)) {
        greatest_info.fail_line = 0x61;
        greatest_info.msg = "expected != obtained";
        greatest_info.assertions = greatest_info.assertions + 2;
        goto LAB_00102f46;
      }
      greatest_info.assertions = uVar11;
      lVar10 = lVar10 + 0x10;
    } while (lVar10 != 0x1ac);
    greatest_info.msg = (char *)0x0;
    iVar9 = 0;
LAB_00102f5f:
    greatest_test_post(iVar9);
  }
  iVar9 = greatest_test_pre("parsing_float");
  if (iVar9 == 1) {
    lVar10 = 0xc;
    do {
      local_30 = (double)CONCAT44(local_30._4_4_,*(undefined4 *)(&UNK_0010616c + lVar10));
      _Var7 = str_to_float(*(char **)(&UNK_00106164 + lVar10),(float *)&local_38);
      if ((_Bool)*(char *)((long)&parsing_float_float_tests + lVar10) != _Var7) {
        greatest_info.fail_line = 0x109;
        greatest_info.msg = "float_tests[i].expect_success != success";
        greatest_info.assertions = greatest_info.assertions + 1;
LAB_0010308d:
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-parsing-utils.c"
        ;
        if ((greatest_info.flags & 4) != 0) goto LAB_00103411;
        iVar9 = -1;
        goto LAB_001030a6;
      }
      uVar11 = greatest_info.assertions + 1;
      if (_Var7) {
        dVar12 = (double)local_30._0_4_;
        greatest_info.assertions = greatest_info.assertions + 2;
        if ((((float)local_38 < local_30._0_4_) &&
            (9.999999747378752e-05 < dVar12 - (double)(float)local_38)) ||
           ((uVar11 = greatest_info.assertions, local_30._0_4_ < (float)local_38 &&
            (9.999999747378752e-05 < (double)(float)local_38 - dVar12)))) {
          fprintf(_stdout,"\nExpected: %g +/- %g\n     Got: %g\n",dVar12,0x3f1a36e2e0000000);
          greatest_info.fail_line = 0x10b;
          greatest_info.msg = "expected != obtained +/- EPSILON";
          goto LAB_0010308d;
        }
      }
      greatest_info.assertions = uVar11;
      lVar10 = lVar10 + 0x10;
    } while (lVar10 != 0x37c);
    greatest_info.msg = (char *)0x0;
    iVar9 = 0;
LAB_001030a6:
    greatest_test_post(iVar9);
  }
  iVar9 = greatest_test_pre("parsing_double");
  if (iVar9 == 1) {
    lVar10 = 0x10;
    do {
      local_30 = *(double *)(&UNK_001064d8 + lVar10);
      _Var7 = str_to_double(*(char **)(&UNK_001064d0 + lVar10),(double *)&local_38);
      if ((_Bool)*(char *)((long)&parsing_double_double_tests + lVar10) != _Var7) {
        greatest_info.fail_line = 0x16e;
        greatest_info.msg = "double_tests[i].expect_success != success";
        greatest_info.assertions = greatest_info.assertions + 1;
LAB_001031c7:
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-parsing-utils.c"
        ;
        if ((greatest_info.flags & 4) != 0) goto LAB_00103411;
        iVar9 = -1;
        goto LAB_001031e0;
      }
      uVar11 = greatest_info.assertions + 1;
      if (_Var7) {
        dVar12 = (double)CONCAT44(local_38._4_4_,(float)local_38);
        greatest_info.assertions = greatest_info.assertions + 2;
        if (((dVar12 < local_30) && (9.999999747378752e-05 < local_30 - dVar12)) ||
           ((uVar11 = greatest_info.assertions, local_30 < dVar12 &&
            (9.999999747378752e-05 < dVar12 - local_30)))) {
          fprintf(_stdout,"\nExpected: %g +/- %g\n     Got: %g\n",local_30,0x3f1a36e2e0000000);
          greatest_info.fail_line = 0x170;
          greatest_info.msg = "expected != obtained +/- EPSILON";
          goto LAB_001031c7;
        }
      }
      greatest_info.assertions = uVar11;
      lVar10 = lVar10 + 0x18;
    } while (lVar10 != 0x538);
    greatest_info.msg = (char *)0x0;
    iVar9 = 0;
LAB_001031e0:
    greatest_test_post(iVar9);
  }
  iVar9 = greatest_test_pre("parsing_usize");
  if (iVar9 == 1) {
    lVar10 = 0x10;
    do {
      lVar5 = *(long *)(&UNK_00106a08 + lVar10);
      _Var7 = str_to_usize(*(char **)(&UNK_00106a00 + lVar10),&local_38);
      if ((_Bool)*(char *)((long)&parsing_usize_usize_tests + lVar10) != _Var7) {
        greatest_info.fail_line = 0xa4;
        greatest_info.msg = "usize_tests[i].expect_success != success";
        greatest_info.assertions = greatest_info.assertions + 1;
LAB_001032a0:
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-parsing-utils.c"
        ;
        if ((greatest_info.flags & 4) != 0) goto LAB_00103411;
        iVar9 = -1;
        goto LAB_001032b9;
      }
      uVar11 = greatest_info.assertions + 1;
      if ((_Var7) &&
         (uVar11 = greatest_info.assertions + 2, lVar5 != CONCAT44(local_38._4_4_,(float)local_38)))
      {
        greatest_info.fail_line = 0xa6;
        greatest_info.msg = "expected != obtained";
        greatest_info.assertions = greatest_info.assertions + 2;
        goto LAB_001032a0;
      }
      greatest_info.assertions = uVar11;
      lVar10 = lVar10 + 0x18;
    } while (lVar10 != 0x298);
    greatest_info.msg = (char *)0x0;
    iVar9 = 0;
LAB_001032b9:
    greatest_test_post(iVar9);
  }
  iVar9 = greatest_test_pre("parsing_bool");
  if (iVar9 == 1) {
    lVar10 = 9;
    do {
      cVar3 = (&UNK_00106c9f)[lVar10];
      _Var7 = str_to_bool(*(char **)(&UNK_00106c97 + lVar10),(_Bool *)&local_38);
      if ((_Bool)*(char *)((long)&parsing_bool_bool_tests + lVar10) != _Var7) {
        greatest_info.fail_line = 0x1aa;
        greatest_info.msg = "bool_tests[i].expect_success != success";
        greatest_info.assertions = greatest_info.assertions + 1;
LAB_00103379:
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-parsing-utils.c"
        ;
        if ((greatest_info.flags & 4) != 0) {
LAB_00103411:
          greatest_info.fail_file =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-parsing-utils.c"
          ;
          abort();
        }
        iVar9 = -1;
        goto LAB_00103392;
      }
      uVar11 = greatest_info.assertions + 1;
      if (_Var7) {
        uVar11 = greatest_info.assertions + 2;
        if ((_Bool)cVar3 != local_38._0_1_) {
          greatest_info.fail_line = 0x1ac;
          greatest_info.msg = "expected != obtained";
          greatest_info.assertions = greatest_info.assertions + 2;
          goto LAB_00103379;
        }
      }
      greatest_info.assertions = uVar11;
      lVar10 = lVar10 + 0x10;
    } while (lVar10 != 0x139);
    greatest_info.msg = (char *)0x0;
    iVar9 = 0;
LAB_00103392:
    greatest_test_post(iVar9);
  }
  GREATEST_PRINT_REPORT();
  return (int)(greatest_info.failed != 0);
}

Assistant:

int main(int argc, char **argv) {
    GREATEST_MAIN_BEGIN(); /* command-line arguments, initialization. */

    /* If tests are run outside of a suite, a default suite is used. */
    RUN_TEST(parsing_int32);
    RUN_TEST(parsing_float);
    RUN_TEST(parsing_double);
    RUN_TEST(parsing_usize);
    RUN_TEST(parsing_bool);

    GREATEST_MAIN_END(); /* display results */
}